

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::FiberPool::Impl::~Impl(Impl *this)

{
  uint uVar1;
  CoreLocalFreelist *pCVar2;
  FiberStack *pFVar3;
  _Map_pointer pppFVar4;
  ulong uVar5;
  _Elt_pointer ppFVar6;
  long lVar7;
  long lVar8;
  _Elt_pointer ppFVar9;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> dangling;
  
  if (this->coreLocalFreelists != (CoreLocalFreelist *)0x0) {
    dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
    super__Deque_impl_data._M_map._0_1_ = 1;
    uVar1 = this->nproc;
    lVar8 = 0;
    dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
    super__Deque_impl_data._M_map_size = (size_t)this;
    for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
      pCVar2 = this->coreLocalFreelists;
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        pFVar3 = *(FiberStack **)((long)&pCVar2->field_0 + lVar7 + lVar8);
        if (pFVar3 != (FiberStack *)0x0) {
          kj::_::FiberStack::~FiberStack(pFVar3);
          operator_delete(pFVar3,0x20);
        }
      }
      lVar8 = lVar8 + 0x40;
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:538:7)>
    ::run((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:538:7)>
           *)&dangling);
  }
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
  lockExclusive((MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>
                 *)&lock,&this->freelist);
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::_Deque_base
            (&dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>,
             &(lock.ptr)->
              super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>);
  pppFVar4 = dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppFVar6 = dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  ppFVar9 = dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  while (ppFVar9 !=
         dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pFVar3 = *ppFVar9;
    if (pFVar3 != (FiberStack *)0x0) {
      kj::_::FiberStack::~FiberStack(pFVar3);
    }
    operator_delete(pFVar3,0x20);
    ppFVar9 = ppFVar9 + 1;
    if (ppFVar9 == ppFVar6) {
      ppFVar9 = pppFVar4[1];
      pppFVar4 = pppFVar4 + 1;
      ppFVar6 = ppFVar9 + 0x40;
    }
  }
  std::_Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::~_Deque_base
            (&dangling.super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)
  ;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::~Locked(&lock);
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
  ~MutexGuarded(&this->freelist);
  return;
}

Assistant:

~Impl() noexcept(false) {
#if USE_CORE_LOCAL_FREELISTS
    if (coreLocalFreelists != nullptr) {
      KJ_DEFER(free(coreLocalFreelists));

      for (uint i: kj::zeroTo(nproc)) {
        for (auto stack: coreLocalFreelists[i].stacks) {
          if (stack != nullptr) {
            delete stack;
          }
        }
      }
    }
#endif

    // Make sure we're not leaking anything from the global freelist either.
    auto lock = freelist.lockExclusive();
    auto dangling = kj::mv(*lock);
    for (auto& stack: dangling) {
      delete stack;
    }
  }